

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O2

uchar * base64_decode(char *data,size_t input_length,size_t *output_length)

{
  char *pcVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  size_t __size;
  
  if (decoding_table == (char *)0x0) {
    build_decoding_table();
  }
  if ((input_length & 3) == 0) {
    __size = (input_length >> 2) * 3;
    *output_length = __size;
    if (data[input_length - 1] == '=') {
      __size = __size - 1;
      *output_length = __size;
    }
    if (data[input_length - 2] == '=') {
      __size = __size - 1;
      *output_length = __size;
    }
    puVar2 = (uchar *)malloc(__size);
    pcVar1 = decoding_table;
    iVar3 = 0;
    if (puVar2 != (uchar *)0x0) {
      for (uVar5 = 0; uVar5 < input_length; uVar5 = uVar5 + 4) {
        iVar4 = 0;
        iVar6 = 0;
        if ((long)data[uVar5] != 0x3d) {
          iVar6 = (int)pcVar1[data[uVar5]] << 0x12;
        }
        if ((long)data[uVar5 + 1] != 0x3d) {
          iVar4 = (int)pcVar1[data[uVar5 + 1]] << 0xc;
        }
        iVar9 = 0;
        iVar8 = 0;
        if ((long)data[uVar5 + 2] != 0x3d) {
          iVar8 = (int)pcVar1[data[uVar5 + 2]] << 6;
        }
        if ((long)data[uVar5 + 3] != 0x3d) {
          iVar9 = (int)pcVar1[data[uVar5 + 3]];
        }
        iVar4 = iVar4 + iVar6 + iVar8 + iVar9;
        uVar7 = (ulong)iVar3;
        if (uVar7 < __size) {
          iVar3 = iVar3 + 1;
          puVar2[uVar7] = (uchar)((uint)iVar4 >> 0x10);
          uVar7 = (ulong)iVar3;
        }
        if (uVar7 < __size) {
          iVar3 = iVar3 + 1;
          puVar2[uVar7] = (uchar)((uint)iVar4 >> 8);
          uVar7 = (ulong)iVar3;
        }
        if (uVar7 < __size) {
          iVar3 = iVar3 + 1;
          puVar2[uVar7] = (uchar)iVar4;
        }
      }
      return puVar2;
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *base64_decode(const char *data,
                             size_t input_length,
                             size_t *output_length) {

    if (decoding_table == NULL) build_decoding_table();

    if (input_length % 4 != 0) return NULL;

    *output_length = input_length / 4 * 3;
    if (data[input_length - 1] == '=') (*output_length)--;
    if (data[input_length - 2] == '=') (*output_length)--;

    unsigned char *decoded_data = malloc(*output_length);
    if (decoded_data == NULL) return NULL;

    for (int i = 0, j = 0; i < input_length;) {

        uint32_t sextet_a = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_b = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_c = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_d = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];

        uint32_t triple = (sextet_a << 3 * 6)
        + (sextet_b << 2 * 6)
        + (sextet_c << 1 * 6)
        + (sextet_d << 0 * 6);

        if (j < *output_length) decoded_data[j++] = (triple >> 2 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 1 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 0 * 8) & 0xFF;
    }

    return decoded_data;
}